

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall
MipsParser::parseRspVectorElement(MipsParser *this,Parser *parser,MipsRegisterValue *dest)

{
  char *__s;
  ulong uVar1;
  bool bVar2;
  Token *pTVar3;
  string *psVar4;
  size_t sVar5;
  Identifier local_100;
  undefined4 local_e0;
  allocator<char> local_d9;
  string local_d8;
  Identifier local_b8;
  ulong local_98;
  size_t i;
  char *local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  char *local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined1 local_50 [8];
  string stringValue;
  Token *token;
  MipsRegisterValue *dest_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  dest->type = RspVectorElement;
  pTVar3 = Parser::peekToken(parser,0);
  if (pTVar3->type == LBrack) {
    Parser::eatToken(parser);
    bVar2 = parseRegisterNumber(this,parser,dest,0x10);
    if (bVar2) {
      pTVar3 = Parser::nextToken(parser);
      this_local._7_1_ = pTVar3->type == RBrack;
    }
    else {
      stringValue.field_2._8_8_ = Parser::nextToken(parser);
      if ((((Token *)stringValue.field_2._8_8_)->type == Integer) ||
         (((Token *)stringValue.field_2._8_8_)->type == NumberString)) {
        psVar4 = Token::getOriginalText_abi_cxx11_((Token *)stringValue.field_2._8_8_);
        std::__cxx11::string::string((string *)local_50,(string *)psVar4);
        local_58._M_current = (char *)std::__cxx11::string::begin();
        local_60 = (char *)std::__cxx11::string::end();
        bVar2 = std::
                any_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(unsigned_int)noexcept>
                          (local_58,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )local_60,iswupper);
        if (bVar2) {
          local_78._M_current = (char *)std::__cxx11::string::begin();
          local_80._M_current = (char *)std::__cxx11::string::end();
          local_88 = (char *)std::__cxx11::string::begin();
          i = (size_t)std::
                      transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                (local_78,local_80,
                                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_88,tolower);
        }
        for (local_98 = 0; uVar1 = local_98,
            sVar5 = std::size<MipsRegisterDescriptor,22ul>(&parseRspVectorElement::rspElementNames),
            uVar1 < sVar5; local_98 = local_98 + 1) {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_50,parseRspVectorElement::rspElementNames[local_98].name)
          ;
          if (bVar2) {
            dest->num = parseRspVectorElement::rspElementNames[local_98].num;
            __s = parseRspVectorElement::rspElementNames[local_98].name;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_d9);
            Identifier::Identifier(&local_b8,&local_d8);
            Identifier::operator=(&dest->name,&local_b8);
            Identifier::~Identifier(&local_b8);
            std::__cxx11::string::~string((string *)&local_d8);
            std::allocator<char>::~allocator(&local_d9);
            pTVar3 = Parser::nextToken(parser);
            this_local._7_1_ = pTVar3->type == RBrack;
            goto LAB_001cd477;
          }
        }
        this_local._7_1_ = false;
LAB_001cd477:
        local_e0 = 1;
        std::__cxx11::string::~string((string *)local_50);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    dest->num = 0;
    memset(&local_100,0,0x20);
    Identifier::Identifier(&local_100);
    Identifier::operator=(&dest->name,&local_100);
    Identifier::~Identifier(&local_100);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool MipsParser::parseRspVectorElement(Parser& parser, MipsRegisterValue& dest)
{
	dest.type = MipsRegisterType::RspVectorElement;

	if (parser.peekToken().type == TokenType::LBrack)
	{
		static const MipsRegisterDescriptor rspElementNames[] = {
			{ "0q", 2 },  { "1q", 3 }, { "0h", 4 },  { "1h", 5 },
			{ "2h", 6 },  { "3h", 7 }, { "0w", 8 },  { "0", 8 },
			{ "1w", 9 },  { "1", 9 },  { "2w", 10 }, { "2", 10 },
			{ "3w", 11 }, { "3", 11 }, { "4w", 12 }, { "4", 12 },
			{ "5w", 13 }, { "5", 13 }, { "6w", 14 }, { "6", 14 },
			{ "7w", 15 }, { "7", 15 },
		};

		parser.eatToken();

		if (parseRegisterNumber(parser, dest, 16))
			return parser.nextToken().type == TokenType::RBrack;

		const Token& token = parser.nextToken();

		if (token.type != TokenType::Integer && token.type != TokenType::NumberString)
			return false;

		//ignore the numerical values, just use the original text as an identifier
		std::string stringValue = token.getOriginalText();
		if (std::any_of(stringValue.begin(), stringValue.end(), iswupper))
		{
			std::transform(stringValue.begin(), stringValue.end(), stringValue.begin(), tolower);
		}

		for (size_t i = 0; i < std::size(rspElementNames); i++)
		{
			if (stringValue == rspElementNames[i].name)
			{
				dest.num = rspElementNames[i].num;
				dest.name = Identifier(rspElementNames[i].name);

				return parser.nextToken().type == TokenType::RBrack;
			}
		}

		return false;
	}

	dest.num = 0;
	dest.name = Identifier();

	return true;

}